

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTableAndIndices(Parse *pParse,Table *pTab,int baseCur,int op)

{
  int iDb_00;
  Vdbe *p;
  KeyInfo *zP4;
  KeyInfo *pKey;
  Vdbe *v;
  Index *pIdx;
  int iDb;
  int i;
  int op_local;
  int baseCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if ((pTab->tabFlags & 0x10) == 0) {
    iDb_00 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    p = sqlite3GetVdbe(pParse);
    sqlite3OpenTable(pParse,baseCur,iDb_00,pTab,op);
    pIdx._4_4_ = 1;
    for (v = (Vdbe *)pTab->pIndex; v != (Vdbe *)0x0; v = (Vdbe *)v->pResultSet) {
      zP4 = sqlite3IndexKeyinfo(pParse,(Index *)v);
      sqlite3VdbeAddOp4(p,op,pIdx._4_4_ + baseCur,*(int *)&v->nResColumn,iDb_00,(char *)zP4,-0x10);
      pIdx._4_4_ = pIdx._4_4_ + 1;
    }
    if (pParse->nTab < baseCur + pIdx._4_4_) {
      pParse->nTab = baseCur + pIdx._4_4_;
    }
    pParse_local._4_4_ = pIdx._4_4_ + -1;
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int baseCur,     /* Cursor number assigned to the table */
  int op           /* OP_OpenRead or OP_OpenWrite */
){
  int i;
  int iDb;
  Index *pIdx;
  Vdbe *v;

  if( IsVirtual(pTab) ) return 0;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3OpenTable(pParse, baseCur, iDb, pTab, op);
  for(i=1, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
    assert( pIdx->pSchema==pTab->pSchema );
    sqlite3VdbeAddOp4(v, op, i+baseCur, pIdx->tnum, iDb,
                      (char*)pKey, P4_KEYINFO_HANDOFF);
    VdbeComment((v, "%s", pIdx->zName));
  }
  if( pParse->nTab<baseCur+i ){
    pParse->nTab = baseCur+i;
  }
  return i-1;
}